

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int set_comp_cast(lyxp_set *trg,lyxp_set *src,lyxp_set_type type,lyd_node *cur_node,
                 lys_module *param_5,uint32_t src_idx,int options)

{
  int iVar1;
  uint32_t src_idx_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  lyxp_set_type type_local;
  lyxp_set *src_local;
  lyxp_set *trg_local;
  
  if (src->type == LYXP_SET_NODE_SET) {
    memset(trg,0,0x40);
    set_insert_node(trg,(src->val).nodes[src_idx].node,(src->val).nodes[src_idx].pos,
                    (src->val).nodes[src_idx].type,0);
    iVar1 = lyxp_set_cast(trg,type,cur_node,param_5,options);
    if (iVar1 == 0) {
      trg_local._4_4_ = 0;
    }
    else {
      set_free_content(trg);
      trg_local._4_4_ = -1;
    }
    return trg_local._4_4_;
  }
  __assert_fail("src->type == LYXP_SET_NODE_SET",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                ,0x5a7,
                "int set_comp_cast(struct lyxp_set *, struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, uint32_t, int)"
               );
}

Assistant:

static int
set_comp_cast(struct lyxp_set *trg, struct lyxp_set *src, enum lyxp_set_type type, const struct lyd_node *cur_node,
              const struct lys_module *local_mod, uint32_t src_idx, int options)
{
    assert(src->type == LYXP_SET_NODE_SET);

    memset(trg, 0, sizeof *trg);

    /* insert node into target set */
    set_insert_node(trg, src->val.nodes[src_idx].node, src->val.nodes[src_idx].pos, src->val.nodes[src_idx].type, 0);

    /* cast target set appropriately */
    if (lyxp_set_cast(trg, type, cur_node, local_mod, options)) {
        set_free_content(trg);
        return -1;
    }

    return EXIT_SUCCESS;
}